

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpGroupMemberDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  IRContext *pIVar1;
  uint32_t type_id;
  _Type member_idx;
  array<signed_char,_4UL> aVar2;
  const_iterator __cbeg;
  Operand *__args;
  pointer pOVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  OperandList new_operands;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a8;
  undefined1 local_88 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_68;
  undefined1 local_60 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  if (inst->opcode_ != OpGroupMemberDecorate) {
    __assert_fail("inst->opcode() == spv::Op::OpGroupMemberDecorate",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x192,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpGroupMemberDecorate(Instruction *)"
                 );
  }
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar10 = false;
  __args = Instruction::GetInOperand(inst,0);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  emplace_back<spvtools::opt::Operand&>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_a8,
             __args);
  pOVar3 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(inst->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pOVar3;
  cVar4 = inst->has_type_id_;
  uVar8 = (uint)inst->has_result_id_;
  uVar6 = (uVar8 & 1) + 1;
  if ((bool)cVar4 == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  if (1 < (int)(uVar7 >> 4) * -0x55555555 - uVar6) {
    uVar9 = 1;
    bVar10 = false;
    do {
      type_id = Instruction::GetSingleWordOperand(inst,uVar6 + uVar9);
      uVar6 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar6 = (uint)inst->has_result_id_;
      }
      member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar9 + uVar6 + 1);
      aVar2._M_elems = (_Type)GetNewMemberIndex(this,type_id,(uint32_t)member_idx);
      if (aVar2._M_elems == (_Type)0xffffffff) {
LAB_005aac44:
        bVar10 = true;
      }
      else {
        uVar7 = (ulong)uVar9;
        pOVar3 = (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                -0x5555555555555555;
        if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
LAB_005aad34:
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_a8,pOVar3 + uVar7);
        if (aVar2._M_elems != member_idx) {
          local_88._0_8_ = &PTR__SmallVector_009488e0;
          local_88._24_8_ = local_88 + 0x10;
          local_68._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_88._8_8_ = 1;
          local_60._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
          local_60._8_8_ = &PTR__SmallVector_009488e0;
          local_60._16_8_ = 0;
          local_60._32_8_ = local_60 + 0x18;
          local_38._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_88._16_4_ = aVar2._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_60 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_88);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_a8,(Operand *)local_60);
          local_60._8_8_ = &PTR__SmallVector_009488e0;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_38._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_38,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_38._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          local_38._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_88._0_8_ = &PTR__SmallVector_009488e0;
          if (local_68._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_68,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_68._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          goto LAB_005aac44;
        }
        uVar7 = (ulong)(uVar9 + 1);
        pOVar3 = (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                -0x5555555555555555;
        if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_005aad34;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_a8,pOVar3 + uVar7);
      }
      uVar9 = uVar9 + 2;
      pOVar3 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3;
      cVar4 = inst->has_type_id_;
      uVar8 = (uint)inst->has_result_id_;
      uVar6 = (uVar8 & 1) + 1;
      if ((bool)cVar4 == false) {
        uVar6 = uVar8;
      }
    } while (uVar9 < (int)(uVar7 >> 4) * -0x55555555 - uVar6);
  }
  if (bVar10) {
    if ((long)local_a8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x30) {
      IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
    }
    else {
      if (cVar4 != '\0') {
        uVar8 = (uVar8 & 1) + 1;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&inst->operands_,
                 (Operand *)
                 ((long)((pOVar3->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar8 * 0x30)),
                 (Operand *)((long)((pOVar3->words).buffer + 0xfffffffffffffffa) + uVar7));
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &inst->operands_,
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_a8.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_a8.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
    }
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_a8);
  return bVar10;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpGroupMemberDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpGroupMemberDecorate);

  bool modified = false;

  Instruction::OperandList new_operands;
  new_operands.emplace_back(inst->GetInOperand(0));
  for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
    uint32_t type_id = inst->GetSingleWordInOperand(i);
    uint32_t member_idx = inst->GetSingleWordInOperand(i + 1);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);

    if (new_member_idx == kRemovedMember) {
      modified = true;
      continue;
    }

    new_operands.emplace_back(inst->GetOperand(i));
    if (new_member_idx != member_idx) {
      new_operands.emplace_back(
          Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));
      modified = true;
    } else {
      new_operands.emplace_back(inst->GetOperand(i + 1));
    }
  }

  if (!modified) {
    return false;
  }

  if (new_operands.size() == 1) {
    context()->KillInst(inst);
    return true;
  }

  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}